

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O2

void nsvg__parseGradientStop(NSVGparser *p,char **attr)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  NSVGgradientData *pNVar4;
  NSVGgradientStop *pNVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar9;
  ulong uVar10;
  char **ppcVar11;
  long lVar8;
  
  iVar2 = p->attrHead;
  p->attr[iVar2].stopColor = 0;
  p->attr[iVar2].stopOpacity = 1.0;
  p->attr[iVar2].stopOffset = 0.0;
  for (ppcVar11 = attr + 1; ppcVar11[-1] != (char *)0x0; ppcVar11 = ppcVar11 + 2) {
    nsvg__parseAttr(p,ppcVar11[-1],*ppcVar11);
  }
  pNVar4 = p->gradients;
  if (pNVar4 == (NSVGgradientData *)0x0) {
    return;
  }
  iVar3 = pNVar4->nstops;
  pNVar4->nstops = iVar3 + 1;
  pNVar5 = (NSVGgradientStop *)realloc(pNVar4->stops,(long)iVar3 * 8 + 8);
  pNVar4->stops = pNVar5;
  if (pNVar5 == (NSVGgradientStop *)0x0) {
    return;
  }
  uVar6 = (long)pNVar4->nstops - 1;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar6) {
    uVar10 = uVar6 & 0xffffffff;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    pfVar1 = &p->attr[iVar2].stopOffset;
    lVar8 = (long)pNVar4->nstops;
    if (*pfVar1 <= pNVar5[uVar9].offset && pNVar5[uVar9].offset != *pfVar1) goto LAB_00117bb7;
  }
LAB_00117bc9:
  pNVar5[uVar6].color =
       (int)(long)(p->attr[iVar2].stopOpacity * 255.0) << 0x18 | p->attr[iVar2].stopColor;
  pNVar5[uVar6].offset = p->attr[iVar2].stopOffset;
  return;
LAB_00117bb7:
  while( true ) {
    lVar7 = lVar8 + -1;
    pNVar5 = pNVar4->stops;
    uVar6 = uVar9;
    if (lVar7 <= (long)uVar9) break;
    pNVar5[lVar7] = pNVar5[lVar8 + -2];
    lVar8 = lVar7;
  }
  goto LAB_00117bc9;
}

Assistant:

static void nsvg__parseGradientStop(NSVGparser* p, const char** attr)
{
	NSVGattrib* curAttr = nsvg__getAttr(p);
	NSVGgradientData* grad;
	NSVGgradientStop* stop;
	int i, idx;

	curAttr->stopOffset = 0;
	curAttr->stopColor = 0;
	curAttr->stopOpacity = 1.0f;

	for (i = 0; attr[i]; i += 2) {
		nsvg__parseAttr(p, attr[i], attr[i + 1]);
	}

	// Add stop to the last gradient.
	grad = p->gradients;
	if (grad == NULL) return;

	grad->nstops++;
	grad->stops = (NSVGgradientStop*)realloc(grad->stops, sizeof(NSVGgradientStop)*grad->nstops);
	if (grad->stops == NULL) return;

	// Insert
	idx = grad->nstops-1;
	for (i = 0; i < grad->nstops-1; i++) {
		if (curAttr->stopOffset < grad->stops[i].offset) {
			idx = i;
			break;
		}
	}
	if (idx != grad->nstops-1) {
		for (i = grad->nstops-1; i > idx; i--)
			grad->stops[i] = grad->stops[i-1];
	}

	stop = &grad->stops[idx];
	stop->color = curAttr->stopColor;
	stop->color |= (unsigned int)(curAttr->stopOpacity*255) << 24;
	stop->offset = curAttr->stopOffset;
}